

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O3

TRef recff_bit64_tohex(jit_State *J,RecordFFData *rd,TRef hdr)

{
  CTState *cts;
  uint uVar1;
  IRRef1 IVar2;
  CTypeID CVar3;
  TRef TVar4;
  uint64_t uVar6;
  uint uVar7;
  IROpT IVar8;
  uint k;
  CTypeID id2;
  CTypeID local_34;
  TRef TVar5;
  
  cts = (CTState *)J[-1].penalty[0x3b].pc.ptr64;
  CVar3 = crec_bit64_type(cts,(cTValue *)*rd->argv);
  TVar4 = J->base[1];
  if (TVar4 == 0) {
    k = (uint)(CVar3 != 0) * 8 + 8;
  }
  else {
    local_34 = 0;
    uVar6 = lj_carith_check64(J->L,2,&local_34);
    k = (uint)uVar6;
    if (local_34 == 0) {
      TVar4 = lj_opt_narrow_tobit(J,TVar4);
      IVar2 = (IRRef1)TVar4;
    }
    else {
      TVar4 = crec_ct_tv(J,cts->tab + 9,0,TVar4,rd->argv + 1);
      IVar2 = (IRRef1)TVar4;
    }
    TVar4 = lj_ir_kint(J,k);
    (J->fold).ins.field_0.ot = 0x893;
    (J->fold).ins.field_0.op1 = IVar2;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
    lj_opt_fold(J);
  }
  uVar7 = -k;
  if (0 < (int)k) {
    uVar7 = k;
  }
  uVar1 = 0xfe;
  if (uVar7 < 0xfe) {
    uVar1 = uVar7;
  }
  if (CVar3 == 0) {
    TVar4 = lj_opt_narrow_tobit(J,*J->base);
    IVar2 = 0x2d3;
    IVar8 = 0x5b16;
    if (uVar7 < 8) {
      TVar5 = lj_ir_kint(J,~(-1 << ((char)uVar1 * '\x04' & 0x1fU)));
      (J->fold).ins.field_0.ot = 0x2113;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
      TVar4 = lj_opt_fold(J);
      IVar2 = 0x2d3;
    }
  }
  else {
    TVar4 = crec_ct_tv(J,cts->tab + CVar3,0,*J->base,rd->argv);
    if (0xf < uVar7) goto LAB_0015e072;
    TVar5 = lj_ir_kint64(J,~(-1L << ((char)uVar1 * '\x04' & 0x3fU)));
    IVar2 = (IRRef1)TVar5;
    IVar8 = 0x2116;
  }
  (J->fold).ins.field_0.ot = IVar8;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
  (J->fold).ins.field_0.op2 = IVar2;
  TVar4 = lj_opt_fold(J);
LAB_0015e072:
  TVar5 = lj_ir_kint(J,(k >> 0x12 & 0x2000) + uVar1 * 0x1000000 + 0x1000014);
  TVar4 = lj_ir_call(J,IRCALL_lj_strfmt_putfxint,(ulong)hdr,(ulong)TVar5,(ulong)TVar4);
  return TVar4;
}

Assistant:

TRef recff_bit64_tohex(jit_State *J, RecordFFData *rd, TRef hdr)
{
  CTState *cts = ctype_ctsG(J2G(J));
  CTypeID id = crec_bit64_type(cts, &rd->argv[0]);
  TRef tr, trsf = J->base[1];
  SFormat sf = (STRFMT_UINT|STRFMT_T_HEX);
  int32_t n;
  if (trsf) {
    CTypeID id2 = 0;
    n = (int32_t)lj_carith_check64(J->L, 2, &id2);
    if (id2)
      trsf = crec_ct_tv(J, ctype_get(cts, CTID_INT32), 0, trsf, &rd->argv[1]);
    else
      trsf = lj_opt_narrow_tobit(J, trsf);
    emitir(IRTGI(IR_EQ), trsf, lj_ir_kint(J, n));  /* Specialize to n. */
  } else {
    n = id ? 16 : 8;
  }
  if (n < 0) { n = (int32_t)(~n+1u); sf |= STRFMT_F_UPPER; }
  if ((uint32_t)n > 254) n = 254;
  sf |= ((SFormat)((n+1)&255) << STRFMT_SH_PREC);
  if (id) {
    tr = crec_ct_tv(J, ctype_get(cts, id), 0, J->base[0], &rd->argv[0]);
    if (n < 16)
      tr = emitir(IRT(IR_BAND, IRT_U64), tr,
		  lj_ir_kint64(J, ((uint64_t)1 << 4*n)-1));
  } else {
    tr = lj_opt_narrow_tobit(J, J->base[0]);
    if (n < 8)
      tr = emitir(IRTI(IR_BAND), tr, lj_ir_kint(J, (int32_t)((1u << 4*n)-1)));
    tr = emitconv(tr, IRT_U64, IRT_INT, 0);  /* No sign-extension. */
    lj_needsplit(J);
  }
  return lj_ir_call(J, IRCALL_lj_strfmt_putfxint, hdr, lj_ir_kint(J, sf), tr);
}